

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O2

int add_attribute_octet(stack_st_X509_ATTRIBUTE *attrs,int nid,uchar *buffer,int len)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  ASN1_STRING *str;
  X509_ATTRIBUTE *pXVar4;
  
  pcVar1 = pname;
  if (d_flag != 0) {
    pcVar3 = OBJ_nid2sn(nid);
    printf("%s: adding octet attribute %s\n",pcVar1,pcVar3);
  }
  str = ASN1_STRING_new();
  iVar2 = ASN1_STRING_set(str,buffer,len);
  if (0 < iVar2) {
    pXVar4 = X509_ATTRIBUTE_create(nid,4,str);
    OPENSSL_sk_push(attrs,pXVar4);
    return 0;
  }
  fprintf(_stderr,"%s: error adding data to ASN.1 string\n",pname);
  ERR_print_errors_fp(_stderr);
  exit(0x61);
}

Assistant:

int add_attribute_octet(STACK_OF(X509_ATTRIBUTE) *attrs, int nid, unsigned char *buffer,
		int len) {
	ASN1_STRING     *asn1_string = NULL;
	X509_ATTRIBUTE  *x509_a;
	int		c;

	if (d_flag)
		printf("%s: adding octet attribute %s\n", pname,
			OBJ_nid2sn(nid));

	asn1_string = ASN1_STRING_new();
	if ((c = ASN1_STRING_set(asn1_string, buffer, len)) <= 0) {
		fprintf(stderr, "%s: error adding data to ASN.1 string\n",
			pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	x509_a = X509_ATTRIBUTE_create(nid, V_ASN1_OCTET_STRING,
		asn1_string);
	sk_X509_ATTRIBUTE_push(attrs, x509_a);
	return (0);

}